

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O1

int __thiscall pg::SSPMSolver::compare_test(SSPMSolver *this,int pindex)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  piVar2 = this->test_d;
  if (*this->tmp_d == -1) {
    uVar4 = (uint)(*piVar2 != -1);
  }
  else {
    uVar4 = 0xffffffff;
    if (*piVar2 != -1) {
      if (0 < (long)this->l) {
        uVar5 = 0;
        do {
          iVar1 = this->tmp_d[uVar5];
          if ((pindex < iVar1) && (pindex < piVar2[uVar5])) break;
          if (iVar1 < piVar2[uVar5]) {
            uVar4 = (((this->tmp_b)._bits[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0) - 1;
LAB_0016762b:
            return uVar4 | 1;
          }
          if (piVar2[uVar5] < iVar1) {
            uVar4 = -(uint)(((this->test_b)._bits[uVar5 >> 6] >> (uVar5 & 0x3f) & 1) != 0);
            goto LAB_0016762b;
          }
          uVar7 = 1L << (uVar5 & 0x3f);
          uVar3 = (this->tmp_b)._bits[uVar5 >> 6];
          uVar6 = (this->test_b)._bits[uVar5 >> 6] & uVar7;
          if (((uVar3 >> (uVar5 & 0x3f) & 1) == 0) && (uVar6 != 0)) {
            return -1;
          }
          if (((uVar3 & uVar7) != 0) && (uVar6 == 0)) {
            return 1;
          }
          uVar5 = uVar5 + 1;
        } while ((long)this->l != uVar5);
      }
      uVar4 = 0;
    }
  }
  return uVar4;
}

Assistant:

int
SSPMSolver::compare_test(int pindex)
{
    // cases involving Top
    if (tmp_d[0] == -1 and test_d[0] == -1) return 0;
    if (tmp_d[0] == -1) return 1;
    if (test_d[0] == -1) return -1;
    for (int i=0; i<l; i++) {
        if (tmp_d[i] > pindex and test_d[i] > pindex) {
            // equal until pindex, return 0
            return 0;
        } else if (tmp_d[i] < test_d[i]) {
            // equal until test has [eps]
            if (tmp_b[i] == 0) return -1;
            else return 1;
        } else if (tmp_d[i] > test_d[i]) {
            // equal until tmp has [eps]
            if (test_b[i] == 0) return 1;
            else return -1;
        } else if (tmp_b[i] < test_b[i]) {
            // equal until tmp<test
            return -1;
        } else if (tmp_b[i] > test_b[i]) {
            // equal until tmp>test
            return 1;
        }
    }
    return 0;
}